

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

TString * str_checkname(LexState *ls)

{
  TString *pTVar1;
  
  check(ls,0x11d);
  pTVar1 = (TString *)(ls->t).seminfo.r;
  luaX_next(ls);
  return pTVar1;
}

Assistant:

static TString*str_checkname(LexState*ls){
TString*ts;
check(ls,TK_NAME);
ts=ls->t.seminfo.ts;
luaX_next(ls);
return ts;
}